

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locks.cc
# Opt level: O2

void __thiscall locks::locks(locks *this,int *lockParameters,char **names)

{
  int iVar1;
  lock *this_00;
  decodeTextUtil *this_01;
  char *__ptr;
  size_t sStack_50;
  int local_3c;
  undefined8 local_38;
  
  this->numberOfLocks = 0;
  this->numberOfKeys = 0;
  this->lastLockMatchedIndex = -1;
  if (lockParameters == (int *)0x0) {
    __ptr = "Lock configuration is illegal - no locks defined\n";
    sStack_50 = 0x31;
  }
  else {
    do {
      local_3c = *lockParameters;
      if (local_3c == 0) {
        return;
      }
      local_38 = *(undefined8 *)(lockParameters + 1);
      this_00 = (lock *)operator_new(0x40);
      lock::lock(this_00,&local_3c,*names);
      this->lockList[this->numberOfLocks] = this_00;
      this_01 = (decodeTextUtil *)operator_new(0x28);
      decodeTextUtil::decodeTextUtil(this_01,&local_3c,*names);
      iVar1 = this->numberOfLocks;
      names = names + 1;
      lockParameters = lockParameters + 3;
      this->decoderList[iVar1] = this_01;
      this->numberOfLocks = iVar1 + 1;
    } while ((long)iVar1 < 9);
    __ptr = "Lock configuration is illegal - exceeded configured limit\n";
    sStack_50 = 0x3a;
  }
  fwrite(__ptr,sStack_50,1,_stderr);
  exit(-1);
}

Assistant:

locks::locks(const int * lockParameters, const char ** names) {
  numberOfLocks = 0;
  numberOfKeys = 0;
  lastLockMatchedIndex = -1;
  int configurationParameters[3];
  if (lockParameters) {
    while (*lockParameters != 0) {
      configurationParameters[0] = *lockParameters++;  // slope
      configurationParameters[1] = *lockParameters++;  // offset
      configurationParameters[2] = *lockParameters++;  // modulo
      lockList[numberOfLocks] = new lock(configurationParameters, *names);
      decoderList[numberOfLocks] = new decodeTextUtil(configurationParameters, *names);
      numberOfLocks++;
      names++;
      if (numberOfLocks >= MAX_NUMBER_OF_LOCKS) {
        fprintf(stderr, "Lock configuration is illegal - exceeded configured limit\n");
        exit(-1);
      }
    }
  } else {
    fprintf(stderr, "Lock configuration is illegal - no locks defined\n");
    exit(-1);
  }
}